

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

bool __thiscall soul::heart::IODeclaration::canHandleType(IODeclaration *this,Type *t)

{
  pointer pTVar1;
  CastType CVar2;
  bool bVar3;
  pointer pTVar4;
  Type local_60;
  Type local_48;
  
  pTVar4 = (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar4 == pTVar1) {
    bVar3 = false;
  }
  else {
    do {
      local_60.category = pTVar4->category;
      local_60.arrayElementCategory = pTVar4->arrayElementCategory;
      local_60.isRef = pTVar4->isRef;
      local_60.isConstant = pTVar4->isConstant;
      local_60.primitiveType.type = (pTVar4->primitiveType).type;
      local_60.boundingSize = pTVar4->boundingSize;
      local_60.arrayElementBoundingSize = pTVar4->arrayElementBoundingSize;
      local_60.structure.object = (pTVar4->structure).object;
      if (local_60.structure.object != (Structure *)0x0) {
        ((local_60.structure.object)->super_RefCountedObject).refCount =
             ((local_60.structure.object)->super_RefCountedObject).refCount + 1;
      }
      getSampleArrayType(&local_48,this,&local_60);
      CVar2 = TypeRules::getCastType(&local_48,t);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_48.structure.object);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_60.structure.object);
      bVar3 = (bool)(CVar2 < wrapValue & (byte)(0x1d6 >> ((byte)CVar2 & 0x1f)));
      pTVar4 = pTVar4 + 1;
    } while (pTVar4 != pTVar1 && bVar3 == false);
  }
  return bVar3;
}

Assistant:

bool canHandleType (const Type& t) const
        {
            for (auto& type : dataTypes)
                if (TypeRules::canSilentlyCastTo (getSampleArrayType (type), t))
                    return true;

            return false;
        }